

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_1730dca::HandleRPathChangeCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  KeywordNameAction *pKVar1;
  bool bVar2;
  bool bVar3;
  cmArgumentParser<void> *pcVar4;
  static_string_view name;
  static_string_view name_00;
  static_string_view name_01;
  static_string_view name_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  bool removeEnvironmentRPath;
  bool changed;
  string emsg;
  string message;
  cmFileTimes ft;
  string file;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  newRPath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  oldRPath;
  ParseResult parseResult;
  cmArgumentParser<void> parser;
  bool local_1ab;
  bool local_1aa;
  char local_1a9;
  undefined1 local_1a8 [32];
  pointer local_188;
  undefined8 local_180;
  undefined1 local_178 [32];
  cmFileTimes local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  undefined1 local_130 [32];
  bool local_110;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  undefined1 local_f0 [32];
  bool local_d0;
  ParseResult local_c8;
  cmArgumentParser<void> local_98;
  
  local_150._M_string_length = 0;
  local_150.field_2._M_local_buf[0] = '\0';
  local_d0 = false;
  local_110 = false;
  local_1ab = false;
  local_98.super_Base.Bindings.Positions.
  super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  .
  super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super_Base.Bindings.Positions.
  super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  .
  super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.super_Base.Bindings.ParsedKeyword._M_invoker = (_Invoker_type)0x0;
  local_98.super_Base.Bindings.Positions.
  super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  .
  super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._8_8_ = 0;
  local_98.super_Base.Bindings.ParsedKeyword.super__Function_base._M_manager = (_Manager_type)0x0;
  local_98.super_Base.Bindings.KeywordMissingValue._M_invoker = (_Invoker_type)0x0;
  local_98.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._M_unused._M_object =
       (void *)0x0;
  local_98.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_functor._8_8_ = 0;
  local_98.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_manager =
       (_Manager_type)0x0;
  local_98.super_Base.Bindings.Keywords.
  super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  .
  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_functor._M_unused.
  _M_object = (void *)0x0;
  local_98.super_Base.Bindings.Keywords.
  super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  .
  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super_Base.Bindings.Keywords.
  super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  .
  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  name.super_string_view._M_str = "FILE";
  name.super_string_view._M_len = 4;
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  pcVar4 = cmArgumentParser<void>::Bind<std::__cxx11::string>(&local_98,name,&local_150);
  name_00.super_string_view._M_str = "OLD_RPATH";
  name_00.super_string_view._M_len = 9;
  pcVar4 = cmArgumentParser<void>::Bind<std::optional<std::__cxx11::string>>
                     (pcVar4,name_00,
                      (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_f0);
  name_01.super_string_view._M_str = "NEW_RPATH";
  name_01.super_string_view._M_len = 9;
  pcVar4 = cmArgumentParser<void>::Bind<std::optional<std::__cxx11::string>>
                     (pcVar4,name_01,
                      (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_130);
  name_02.super_string_view._M_str = "INSTALL_REMOVE_ENVIRONMENT_RPATH";
  name_02.super_string_view._M_len = 0x20;
  cmArgumentParser<void>::Bind<bool>(pcVar4,name_02,&local_1ab);
  local_1a8._8_8_ =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_1a8._0_8_ =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start + 1;
  cmArgumentParser<void>::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            (&local_c8,&local_98,
             (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)local_1a8,&local_108,0);
  if (local_108.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_108.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar2 = ArgumentParser::ParseResult::MaybeReportError(&local_c8,status->Makefile);
    bVar3 = true;
    if (bVar2) goto LAB_0044766f;
    if (local_150._M_string_length == 0) {
      local_1a8._0_8_ = local_1a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"RPATH_CHANGE not given FILE option.","");
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
    else if (local_d0 == false) {
      local_1a8._0_8_ = local_1a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"RPATH_CHANGE not given OLD_RPATH option.","");
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
    else {
      if (local_110 != false) {
        bVar2 = cmsys::SystemTools::FileExists(&local_150,true);
        if (!bVar2) {
          cmStrCat<char_const(&)[26],std::__cxx11::string&,char_const(&)[23]>
                    ((string *)local_1a8,(char (*) [26])"RPATH_CHANGE given FILE \"",&local_150,
                     (char (*) [23])"\" that does not exist.");
          std::__cxx11::string::_M_assign((string *)&status->Error);
          local_178._16_8_ = local_1a8._16_8_;
          local_178._0_8_ = local_1a8._0_8_;
          if ((pointer)local_1a8._0_8_ != (pointer)(local_1a8 + 0x10)) goto LAB_00447665;
          goto LAB_0044766d;
        }
        cmFileTimes::cmFileTimes(&local_158,&local_150);
        local_1a8._8_8_ = (pointer)0x0;
        local_1a8._16_8_ = local_1a8._16_8_ & 0xffffffffffffff00;
        local_1a8._0_8_ = (pointer)(local_1a8 + 0x10);
        bVar3 = cmSystemTools::ChangeRPath
                          (&local_150,(string *)local_f0,(string *)local_130,local_1ab,
                           (string *)local_1a8,&local_1aa);
        if (bVar3) {
LAB_00447522:
          if (local_1aa == true) {
            local_1a9 = '\"';
            cmStrCat<char_const(&)[47],std::__cxx11::string&,char_const(&)[7],std::__cxx11::string&,char>
                      ((string *)local_178,
                       (char (*) [47])"Set non-toolchain portion of runtime path of \"",&local_150,
                       (char (*) [7])"\" to \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_130,&local_1a9);
            cmMakefile::DisplayStatus(status->Makefile,(string *)local_178,-1.0);
            if ((pointer)local_178._0_8_ != (pointer)(local_178 + 0x10)) {
              operator_delete((void *)local_178._0_8_,(ulong)(local_178._16_8_ + 1));
            }
          }
          cmFileTimes::Store(&local_158,&local_150);
        }
        else {
          cmStrCat<char_const(&)[43],std::__cxx11::string&,char_const(&)[17],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                    ((string *)local_178,
                     (char (*) [43])"RPATH_CHANGE could not write new RPATH:\n  ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130,
                     (char (*) [17])"\nto the file:\n  ",&local_150,(char (*) [2])0x97179e,
                     (string *)local_1a8);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          if ((pointer)local_178._0_8_ != (pointer)(local_178 + 0x10)) {
            operator_delete((void *)local_178._0_8_,(ulong)(local_178._16_8_ + 1));
          }
          if (bVar3) goto LAB_00447522;
        }
        if ((pointer)local_1a8._0_8_ != (pointer)(local_1a8 + 0x10)) {
          operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
        }
        cmFileTimes::~cmFileTimes(&local_158);
        goto LAB_0044766f;
      }
      local_1a8._0_8_ = local_1a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"RPATH_CHANGE not given NEW_RPATH option.","");
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
    local_178._16_8_ = local_1a8._16_8_;
    local_178._0_8_ = local_1a8._0_8_;
    if ((pointer)local_1a8._0_8_ != (pointer)(local_1a8 + 0x10)) goto LAB_00447665;
  }
  else {
    local_1a8._0_8_ = (pointer)0x24;
    local_1a8._8_8_ = "RPATH_CHANGE given unknown argument ";
    local_1a8._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_188 = ((local_108.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    local_1a8._24_8_ =
         (local_108.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    local_180 = 0;
    views._M_len = 2;
    views._M_array = (iterator)local_1a8;
    cmCatViews((string *)local_178,views);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((pointer)local_178._0_8_ != (pointer)(local_178 + 0x10)) {
LAB_00447665:
      operator_delete((void *)local_178._0_8_,
                      (ulong)((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_178._16_8_)->_M_dataplus)._M_p + 1));
    }
  }
LAB_0044766d:
  bVar3 = false;
LAB_0044766f:
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_108);
  std::
  vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ::~vector(&local_98.super_Base.Bindings.Positions.
             super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
           );
  if (local_98.super_Base.Bindings.ParsedKeyword.super__Function_base._M_manager !=
      (_Manager_type)0x0) {
    pKVar1 = &local_98.super_Base.Bindings.ParsedKeyword;
    (*local_98.super_Base.Bindings.ParsedKeyword.super__Function_base._M_manager)
              ((_Any_data *)pKVar1,(_Any_data *)pKVar1,__destroy_functor);
  }
  if (local_98.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_manager !=
      (_Manager_type)0x0) {
    pKVar1 = &local_98.super_Base.Bindings.KeywordMissingValue;
    (*local_98.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_manager)
              ((_Any_data *)pKVar1,(_Any_data *)pKVar1,__destroy_functor);
  }
  std::
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
             *)&local_98);
  if ((local_110 == true) && (local_110 = false, (undefined1 *)local_130._0_8_ != local_130 + 0x10))
  {
    operator_delete((void *)local_130._0_8_,local_130._16_8_ + 1);
  }
  if ((local_d0 == true) && (local_d0 = false, (undefined1 *)local_f0._0_8_ != local_f0 + 0x10)) {
    operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,
                    CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                             local_150.field_2._M_local_buf[0]) + 1);
  }
  return bVar3;
}

Assistant:

bool HandleRPathChangeCommand(std::vector<std::string> const& args,
                              cmExecutionStatus& status)
{
  // Evaluate arguments.
  std::string file;
  cm::optional<std::string> oldRPath;
  cm::optional<std::string> newRPath;
  bool removeEnvironmentRPath = false;
  cmArgumentParser<void> parser;
  std::vector<std::string> unknownArgs;
  parser.Bind("FILE"_s, file)
    .Bind("OLD_RPATH"_s, oldRPath)
    .Bind("NEW_RPATH"_s, newRPath)
    .Bind("INSTALL_REMOVE_ENVIRONMENT_RPATH"_s, removeEnvironmentRPath);
  ArgumentParser::ParseResult parseResult =
    parser.Parse(cmMakeRange(args).advance(1), &unknownArgs);
  if (!unknownArgs.empty()) {
    status.SetError(
      cmStrCat("RPATH_CHANGE given unknown argument ", unknownArgs.front()));
    return false;
  }
  if (parseResult.MaybeReportError(status.GetMakefile())) {
    return true;
  }
  if (file.empty()) {
    status.SetError("RPATH_CHANGE not given FILE option.");
    return false;
  }
  if (!oldRPath) {
    status.SetError("RPATH_CHANGE not given OLD_RPATH option.");
    return false;
  }
  if (!newRPath) {
    status.SetError("RPATH_CHANGE not given NEW_RPATH option.");
    return false;
  }
  if (!cmSystemTools::FileExists(file, true)) {
    status.SetError(
      cmStrCat("RPATH_CHANGE given FILE \"", file, "\" that does not exist."));
    return false;
  }
  bool success = true;
  cmFileTimes const ft(file);
  std::string emsg;
  bool changed;

  if (!cmSystemTools::ChangeRPath(file, *oldRPath, *newRPath,
                                  removeEnvironmentRPath, &emsg, &changed)) {
    status.SetError(cmStrCat("RPATH_CHANGE could not write new RPATH:\n  ",
                             *newRPath, "\nto the file:\n  ", file, "\n",
                             emsg));
    success = false;
  }
  if (success) {
    if (changed) {
      std::string message =
        cmStrCat("Set non-toolchain portion of runtime path of \"", file,
                 "\" to \"", *newRPath, '"');
      status.GetMakefile().DisplayStatus(message, -1);
    }
    ft.Store(file);
  }
  return success;
}